

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_widgets.cpp
# Opt level: O0

bool __thiscall
QTest::QTouchEventWidgetSequence::commit(QTouchEventWidgetSequence *this,bool processEvents)

{
  QWindow *pQVar1;
  bool bVar2;
  byte bVar3;
  byte in_SIL;
  long in_RDI;
  long in_FS_OFFSET;
  bool ret;
  undefined4 in_stack_ffffffffffffff58;
  ProcessEventsFlag in_stack_ffffffffffffff5c;
  QWidget *in_stack_ffffffffffffff60;
  QMap<int,_QEventPoint> *in_stack_ffffffffffffff68;
  QPointingDevice *pQVar4;
  bool local_72;
  bool local_61;
  uint local_60;
  uint local_5c;
  undefined1 local_58 [28];
  uint local_3c;
  undefined1 local_38 [28];
  int local_1c;
  duration<long,std::ratio<1l,1000l>> local_18 [8];
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_72 = false;
  bVar2 = QMap<int,_QEventPoint>::isEmpty((QMap<int,_QEventPoint> *)in_stack_ffffffffffffff60);
  if (bVar2) {
    local_61 = false;
  }
  else {
    local_1c = 1;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_18,&local_1c);
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1000l>,void>
              ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffff60,
               (duration<long,_std::ratio<1L,_1000L>_> *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    QThread::sleep(local_10);
    if (*(long *)(in_RDI + 0x18) == 0) {
      if (*(long *)(in_RDI + 0x30) != 0) {
        in_stack_ffffffffffffff60 = (QWidget *)QWidget::windowHandle(in_stack_ffffffffffffff60);
        pQVar4 = *(QPointingDevice **)(in_RDI + 0x20);
        QMap<int,_QEventPoint>::values((QMap<int,_QEventPoint> *)pQVar4);
        QFlags<Qt::KeyboardModifier>::QFlags
                  ((QFlags<Qt::KeyboardModifier> *)in_stack_ffffffffffffff60,
                   in_stack_ffffffffffffff5c);
        bVar3 = qt_handleTouchEventv2
                          ((QWindow *)in_stack_ffffffffffffff60,pQVar4,(QList_conflict2 *)local_58,
                           (QFlags_conflict1 *)(ulong)local_5c);
        local_72 = (bool)(bVar3 & 1);
        QList<QEventPoint>::~QList((QList<QEventPoint> *)0x357a5f);
      }
    }
    else {
      pQVar1 = *(QWindow **)(in_RDI + 0x18);
      pQVar4 = *(QPointingDevice **)(in_RDI + 0x20);
      QMap<int,_QEventPoint>::values(in_stack_ffffffffffffff68);
      QFlags<Qt::KeyboardModifier>::QFlags
                ((QFlags<Qt::KeyboardModifier> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c
                );
      bVar3 = qt_handleTouchEventv2
                        (pQVar1,pQVar4,(QList_conflict2 *)local_38,
                         (QFlags_conflict1 *)(ulong)local_3c);
      local_72 = (bool)(bVar3 & 1);
      QList<QEventPoint>::~QList((QList<QEventPoint> *)0x3579ee);
    }
    if ((in_SIL & 1) != 0) {
      QFlags<QEventLoop::ProcessEventsFlag>::QFlags
                ((QFlags<QEventLoop::ProcessEventsFlag> *)in_stack_ffffffffffffff60,
                 in_stack_ffffffffffffff5c);
      QCoreApplication::processEvents((QFlags_conflict1 *)(ulong)local_60);
    }
    QMap<int,_QEventPoint>::operator=
              ((QMap<int,_QEventPoint> *)in_stack_ffffffffffffff60,
               (QMap<int,_QEventPoint> *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    QMap<int,_QEventPoint>::clear((QMap<int,_QEventPoint> *)in_stack_ffffffffffffff60);
    local_61 = local_72;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_61;
}

Assistant:

bool QTouchEventWidgetSequence::commit(bool processEvents)
{
    bool ret = false;
    if (points.isEmpty())
        return ret;
    QThread::sleep(std::chrono::milliseconds{1});
    if (targetWindow) {
        ret = qt_handleTouchEventv2(targetWindow, device, points.values());
    } else if (targetWidget) {
        ret = qt_handleTouchEventv2(targetWidget->windowHandle(), device, points.values());
    }
    if (processEvents)
        QCoreApplication::processEvents();
    previousPoints = points;
    points.clear();
    return ret;
}